

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O1

FuncVec * __thiscall
dg::llvmdg::LLVMPTACallGraphImpl::callees
          (FuncVec *__return_storage_ptr__,LLVMPTACallGraphImpl *this,Function *F)

{
  pointer *pppFVar1;
  iterator __position;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr *pp_Var4;
  _Rb_tree_header *p_Var5;
  
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var5 = &(this->_cg)._mapping._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->_cg)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var5->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(Function **)(p_Var3 + 1) < F]) {
    if (*(Function **)(p_Var3 + 1) >= F) {
      p_Var2 = p_Var3;
    }
  }
  p_Var3 = &p_Var5->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var5) && (p_Var3 = p_Var2, F < *(Function **)(p_Var2 + 1))) {
    p_Var3 = &p_Var5->_M_header;
  }
  pp_Var4 = (_Base_ptr *)0x0;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    pp_Var4 = &p_Var3[1]._M_parent;
  }
  p_Var2 = pp_Var4[2];
  for (p_Var3 = pp_Var4[1]; p_Var3 != p_Var2; p_Var3 = (_Base_ptr)&p_Var3->_M_parent) {
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
      _M_realloc_insert<llvm::Function_const*const&>
                ((vector<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)
                 __return_storage_ptr__,__position,(Function **)(*(long *)p_Var3 + 0x38));
    }
    else {
      *__position._M_current = *(Function **)(*(long *)p_Var3 + 0x38);
      pppFVar1 = &(__return_storage_ptr__->
                  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FuncVec callees(const llvm::Function *F) override {
        FuncVec ret;
        const auto *fnd = _cg.get(F);
        for (auto *nd : fnd->getCalls()) {
            ret.push_back(nd->getValue());
        }
        return ret;
    }